

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMaterial.h
# Opt level: O0

bool __thiscall irr::video::SMaterial::isAlphaBlendOperation(SMaterial *this)

{
  bool bVar1;
  E_BLEND_FACTOR *in_RDI;
  u32 alphaSource;
  E_MODULATE_FUNC modulo;
  E_BLEND_FACTOR dstAlphaFact;
  E_BLEND_FACTOR srcAlphaFact;
  E_BLEND_FACTOR dstRGBFact;
  E_BLEND_FACTOR srcRGBFact;
  u32 *in_stack_ffffffffffffffc8;
  E_BLEND_FACTOR factor;
  E_BLEND_FACTOR factor_00;
  E_BLEND_FACTOR factor_01;
  E_BLEND_FACTOR factor_02;
  
  if (((*(ushort *)((long)in_RDI + 0xa2) >> 7 & 0xf) != 0) &&
     (((float)in_RDI[0x29] != 0.0 || (NAN((float)in_RDI[0x29]))))) {
    factor_02 = EBF_ZERO;
    factor_01 = EBF_ZERO;
    factor_00 = EBF_ZERO;
    factor = EBF_ZERO;
    unpack_textureBlendFuncSeparate
              (in_RDI,(E_BLEND_FACTOR *)0x0,(E_BLEND_FACTOR *)0x0,(E_BLEND_FACTOR *)0x100000000,
               in_RDI,in_stack_ffffffffffffffc8,0.0);
    bVar1 = textureBlendFunc_hasAlpha(factor_02);
    if ((bVar1) ||
       (((bVar1 = textureBlendFunc_hasAlpha(factor_01), bVar1 ||
         (bVar1 = textureBlendFunc_hasAlpha(factor_00), bVar1)) ||
        (bVar1 = textureBlendFunc_hasAlpha(factor), bVar1)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool isAlphaBlendOperation() const
	{
		if (BlendOperation != EBO_NONE && BlendFactor != 0.f) {
			E_BLEND_FACTOR srcRGBFact = EBF_ZERO;
			E_BLEND_FACTOR dstRGBFact = EBF_ZERO;
			E_BLEND_FACTOR srcAlphaFact = EBF_ZERO;
			E_BLEND_FACTOR dstAlphaFact = EBF_ZERO;
			E_MODULATE_FUNC modulo = EMFN_MODULATE_1X;
			u32 alphaSource = 0;

			unpack_textureBlendFuncSeparate(srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact, modulo, alphaSource, BlendFactor);

			if (textureBlendFunc_hasAlpha(srcRGBFact) || textureBlendFunc_hasAlpha(dstRGBFact) ||
					textureBlendFunc_hasAlpha(srcAlphaFact) || textureBlendFunc_hasAlpha(dstAlphaFact)) {
				return true;
			}
		}
		return false;
	}